

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

bool __thiscall
pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
          (LightVector<siamese::EncoderSubwindow_*,_25U> *this,uint elements)

{
  LightVector<siamese::EncoderSubwindow_*,_25U> *pLVar1;
  bool bVar2;
  EncoderSubwindow **ppEVar3;
  uint uVar4;
  
  if (this->Allocated < elements) {
    uVar4 = elements * 3 >> 1;
    ppEVar3 = (EncoderSubwindow **)operator_new__((ulong)uVar4 * 8,(nothrow_t *)&std::nothrow);
    if (ppEVar3 != (EncoderSubwindow **)0x0) {
      pLVar1 = (LightVector<siamese::EncoderSubwindow_*,_25U> *)this->DataPtr;
      this->Allocated = uVar4;
      this->DataPtr = ppEVar3;
      if (pLVar1 != (LightVector<siamese::EncoderSubwindow_*,_25U> *)0x0 && pLVar1 != this) {
        operator_delete__(pLVar1);
      }
      if (ppEVar3 != (EncoderSubwindow **)0x0) goto LAB_0014e24d;
    }
    bVar2 = false;
  }
  else {
LAB_0014e24d:
    this->Size = elements;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }